

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O0

void __thiscall DataSet::save(DataSet *this,string *filepath,WriteInfo *info)

{
  byte bVar1;
  bool bVar2;
  ostream *this_00;
  size_type sVar3;
  const_reference pvVar4;
  double dVar5;
  Shape SVar6;
  uint uStack_298;
  uint uStack_27c;
  uint local_274;
  uint j;
  uint local_25c;
  uint local_250;
  uint local_24c;
  uint i_1;
  uint i;
  Shape local_238 [2];
  long local_220;
  ofstream file;
  WriteInfo *info_local;
  string *filepath_local;
  DataSet *this_local;
  
  std::ofstream::ofstream(&local_220,(string *)filepath,_S_out);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) == 0) {
    if ((info->shape_skip & 1U) == 0) {
      SVar6 = Matrix<double>::shape(&this->m_matrix);
      local_238[0]._0_8_ = SVar6._0_8_;
      local_238[0].is_diogonal = SVar6.is_diogonal;
      this_00 = operator<<((ostream *)&local_220,local_238);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    if ((info->header_skip & 1U) == 0) {
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->m_labels);
      if (!bVar2) {
        local_24c = 0;
        while( true ) {
          sVar3 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&this->m_labels);
          if (sVar3 <= local_24c) break;
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&this->m_labels,(ulong)local_24c);
          std::operator<<((ostream *)&local_220,(string *)pvVar4);
          sVar3 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&this->m_labels);
          if ((ulong)local_24c < sVar3 - 1) {
            std::operator<<((ostream *)&local_220,',');
          }
          local_24c = local_24c + 1;
        }
        std::ostream::operator<<(&local_220,std::endl<char,std::char_traits<char>>);
      }
    }
    local_250 = 0;
    while( true ) {
      SVar6 = Matrix<double>::shape(&this->m_matrix);
      local_25c = SVar6.n_row;
      if (local_25c <= local_250) break;
      local_274 = 0;
      while( true ) {
        SVar6 = Matrix<double>::shape(&this->m_matrix);
        uStack_27c = SVar6.n_col;
        if (uStack_27c <= local_274) break;
        dVar5 = Matrix<double>::get(&this->m_matrix,local_250,local_274);
        std::ostream::operator<<(&local_220,dVar5);
        SVar6 = Matrix<double>::shape(&this->m_matrix);
        uStack_298 = SVar6.n_col;
        if (local_274 < uStack_298 - 1) {
          std::operator<<((ostream *)&local_220,", ");
        }
        local_274 = local_274 + 1;
      }
      std::ostream::operator<<(&local_220,std::endl<char,std::char_traits<char>>);
      local_250 = local_250 + 1;
    }
    std::ofstream::close();
    std::ofstream::~ofstream(&local_220);
    return;
  }
  std::operator<<((ostream *)&std::cout,"ERROR [saving dataset]: Couldn\'t open up the file!\n");
  exit(1);
}

Assistant:

void DataSet::save(const std::string& filepath, const WriteInfo& info) const{
    std::ofstream file(filepath);
    
    if(!file){
        std::cout<<"ERROR [saving dataset]: Couldn't open up the file!\n";
        exit(1);
    }

    if(!info.shape_skip){
        file<<m_matrix.shape()<<std::endl;
    }
    if(!info.header_skip && !m_labels.empty()){
        for(unsigned i=0;i<m_labels.size();++i){
            file<<m_labels[i];
            if(i<m_labels.size()-1) file<<',';
        }   file<<std::endl;
    }

    for(unsigned i=0;i<m_matrix.shape().n_row;++i){
        for(unsigned j=0;j<m_matrix.shape().n_col;++j){
            file<<m_matrix.get(i,j);
            if(j<m_matrix.shape().n_col-1) file<<", ";
        }   file<<std::endl;
    }

    file.close();
}